

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

int __thiscall
ON_PolyCurve::GetNurbForm(ON_PolyCurve *this,ON_NurbsCurve *nurb,double tol,ON_Interval *subdomain)

{
  ulong uVar1;
  uint uVar2;
  double *pdVar3;
  ON_Curve *pOVar4;
  _func_int *p_Var5;
  ON_3dPoint start_point;
  long lVar6;
  ON_NurbsCurve *this_00;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  double extraout_XMM0_Qa;
  double dVar15;
  double in_XMM1_Qa;
  ON_Interval domain;
  ON_3dPoint P;
  ON_NurbsCurve c;
  ON_3dPoint PEnd;
  ON_3dPoint PStart;
  ON_Interval local_108;
  double local_f8;
  ON_Interval *local_f0;
  ulong local_e8;
  ON_NurbsCurve *local_e0;
  long local_d8;
  ON_3dPoint local_d0;
  ON_NurbsCurve local_b8;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  local_f8 = tol;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  local_108.m_t[0] = extraout_XMM0_Qa;
  local_108.m_t[1] = in_XMM1_Qa;
  bVar7 = ON_Interval::IsIncreasing(&local_108);
  if (!bVar7) {
    return 0;
  }
  uVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  lVar10 = (long)(int)uVar2;
  if (subdomain != (ON_Interval *)0x0) {
    bVar7 = ON_Interval::IsIncreasing(subdomain);
    if (!bVar7) {
      return 0;
    }
    dVar15 = ON_Interval::Min(subdomain);
    bVar7 = ON_Interval::Includes(&local_108,dVar15,false);
    if (!bVar7) {
      return 0;
    }
    dVar15 = ON_Interval::Max(subdomain);
    bVar7 = ON_Interval::Includes(&local_108,dVar15,false);
    if (!bVar7) {
      return 0;
    }
    local_108.m_t[0] = subdomain->m_t[0];
    local_108.m_t[1] = subdomain->m_t[1];
  }
  pdVar3 = (this->m_t).m_a;
  uVar9 = 0;
  uVar13 = 0;
  if (0 < (int)uVar2) {
    uVar13 = (ulong)uVar2;
  }
  do {
    if (uVar13 == uVar9) goto LAB_0058a8f6;
    uVar1 = uVar9 + 1;
    lVar11 = uVar9 + 1;
    uVar9 = uVar1;
  } while (pdVar3[lVar11] <= local_108.m_t[0]);
  uVar13 = (ulong)((int)uVar1 - 1);
LAB_0058a8f6:
  lVar12 = (long)(int)uVar13;
  lVar11 = (lVar10 << 0x20) + 0x100000000;
  iVar14 = uVar2 + 1;
  do {
    if (lVar10 <= lVar12) {
      return 0;
    }
    lVar6 = lVar10 + -1;
    lVar10 = lVar10 + -1;
    lVar11 = lVar11 + -0x100000000;
    iVar14 = iVar14 + -1;
  } while (local_108.m_t[1] <= pdVar3[lVar6]);
  local_f0 = subdomain;
  local_e0 = nurb;
  ON_NurbsCurve::ON_NurbsCurve(&local_b8);
  this_00 = local_e0;
  iVar8 = 0;
  if ((int)uVar13 < iVar14) {
    local_d8 = 0;
    local_e8 = uVar13;
    iVar14 = 0;
    do {
      pOVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar12];
      if (pOVar4 == (ON_Curve *)0x0) {
LAB_0058aafe:
        iVar8 = 0;
LAB_0058ab04:
        ON_NurbsCurve::~ON_NurbsCurve(&local_b8);
        return iVar8;
      }
      p_Var5 = (pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f];
      bVar7 = local_d8 == 0;
      local_d8 = local_d8 + -1;
      if (bVar7) {
        iVar8 = (*p_Var5)(local_f8,pOVar4,this_00,0);
        if (iVar8 < 1) goto LAB_0058ab04;
        pdVar3 = (this->m_t).m_a;
        (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (pdVar3[local_e8],pdVar3[local_e8 + 1],this_00);
      }
      else {
        iVar8 = (*p_Var5)(local_f8,pOVar4,&local_b8,0);
        if (iVar8 < 1) goto LAB_0058ab04;
        if (iVar8 < iVar14) {
          iVar8 = iVar14;
        }
        pdVar3 = (this->m_t).m_a;
        ON_NurbsCurve::SetDomain(&local_b8,pdVar3[lVar12],pdVar3[lVar12 + 1]);
        ON_Curve::PointAtEnd(&local_78,&this_00->super_ON_Curve);
        ON_Curve::PointAtStart(&local_48,&local_b8.super_ON_Curve);
        ON_3dPoint::operator+(&local_60,&local_78,&local_48);
        ::operator*(&local_d0,0.5,&local_60);
        (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])
                  (this_00);
        start_point.y = local_d0.y;
        start_point.x = local_d0.x;
        start_point.z = local_d0.z;
        ON_NurbsCurve::SetStartPoint(&local_b8,start_point);
        bVar7 = ON_NurbsCurve::Append(this_00,&local_b8);
        if (!bVar7) goto LAB_0058aafe;
        ON_NurbsCurve::Destroy(&local_b8);
      }
      lVar12 = lVar12 + 1;
      iVar14 = iVar8;
    } while (lVar12 < lVar11 >> 0x20);
  }
  ON_NurbsCurve::~ON_NurbsCurve(&local_b8);
  if (local_f0 != (ON_Interval *)0x0) {
    (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3c])(this_00);
  }
  return iVar8;
}

Assistant:

int ON_PolyCurve::GetNurbForm( 
                              ON_NurbsCurve& nurb, 
                              double tol,
                              const ON_Interval* subdomain  // OPTIONAL subdomain of ON::ProxyCurve::Domain()
                              ) const
{
  ON_Interval domain = Domain();
  if ( !domain.IsIncreasing() )
    return false;
  int rc = 0;
  int si0 = 0;
  int si1 = Count();
  if ( subdomain ) {
    if ( !subdomain->IsIncreasing() )
      return 0;
    if ( !domain.Includes(subdomain->Min()) )
      return 0;
    if ( !domain.Includes(subdomain->Max()) )
      return 0;
    domain = *subdomain;
  }

  while ( si0 < si1 && m_t[si0+1] <= domain.m_t[0] )
    si0++;
  while ( si0 < si1 && m_t[si1-1] >= domain.m_t[1] )
    si1--;
  if ( si0 >= si1 )
    return 0;
  {
    ON_NurbsCurve c;
    int i, rci;
    for ( i = si0; i < si1; i++ ) {
      if ( !m_segment[i] )
        return 0;
      if ( i == si0 ) {
        rc = m_segment[i]->GetNurbForm( nurb, tol, nullptr );
        if ( rc < 1 )
          return rc;
        nurb.SetDomain( m_t[i], m_t[i+1] );
      }
      else {
        rci = m_segment[i]->GetNurbForm( c, tol, nullptr );
        if ( rci < 1 )
          return rci;
        else if ( rc < rci )
          rc = rci;
        c.SetDomain( m_t[i], m_t[i+1] );
        ON_3dPoint PEnd = nurb.PointAtEnd();
        ON_3dPoint PStart = c.PointAtStart();
        ON_3dPoint P = 0.5*(PEnd+PStart);
        nurb.SetEndPoint(P);
        c.SetStartPoint(P);
        if ( !nurb.Append( c ) )
          return 0;
        c.Destroy();
      }
    }
  }

  if ( subdomain )
    nurb.Trim( *subdomain );

  return rc;
}